

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_a5c01::SimpleRule::SimpleRule
          (SimpleRule *this,KeyType *key,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *inputs,
          ComputeFnType *compute,ValidFnType *valid)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR___cxa_pure_virtual_00203cb8;
  (this->super_Rule).key.key._M_dataplus._M_p = (pointer)&(this->super_Rule).key.key.field_2;
  pcVar1 = (key->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Rule).key,pcVar1,pcVar1 + (key->key)._M_string_length);
  (this->super_Rule).signature.value = 0;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__SimpleRule_00203078;
  *(undefined8 *)&(this->compute).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->compute).super__Function_base._M_functor + 8) = 0;
  (this->compute).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->compute)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (compute->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->compute,(_Any_data *)compute,__clone_functor);
    (this->compute)._M_invoker = compute->_M_invoker;
    (this->compute).super__Function_base._M_manager = (compute->super__Function_base)._M_manager;
  }
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector
            (&this->inputs,inputs);
  (this->valid).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->valid)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->valid).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->valid).super__Function_base._M_functor + 8) = 0;
  p_Var2 = (valid->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->valid,(_Any_data *)valid,__clone_functor);
    (this->valid)._M_invoker = valid->_M_invoker;
    (this->valid).super__Function_base._M_manager = (valid->super__Function_base)._M_manager;
  }
  return;
}

Assistant:

SimpleRule(const KeyType& key, const std::vector<KeyType>& inputs,
               SimpleTask::ComputeFnType compute, ValidFnType valid = nullptr)
        : Rule(key), compute(compute), inputs(inputs), valid(valid) { }